

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_telemetry_messenger.c
# Opt level: O0

int process_event_send_timeouts(TELEMETRY_MESSENGER_INSTANCE_conflict *instance)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l;
  TELEMETRY_MESSENGER_EVENT_SEND_COMPLETE_RESULT send_result;
  int is_timed_out;
  MESSENGER_SEND_EVENT_TASK *task;
  LIST_ITEM_HANDLE list_item;
  TELEMETRY_MESSENGER_INSTANCE_conflict *pTStack_10;
  int result;
  TELEMETRY_MESSENGER_INSTANCE_conflict *instance_local;
  
  list_item._4_4_ = 0;
  if (instance->event_send_timeout_secs != 0) {
    pTStack_10 = instance;
    for (task = (MESSENGER_SEND_EVENT_TASK *)
                singlylinkedlist_get_head_item(instance->in_progress_list);
        task != (MESSENGER_SEND_EVENT_TASK *)0x0;
        task = (MESSENGER_SEND_EVENT_TASK *)singlylinkedlist_get_next_item((LIST_ITEM_HANDLE)task))
    {
      _send_result = (undefined8 *)singlylinkedlist_item_get_value((LIST_ITEM_HANDLE)task);
      if ((_send_result != (undefined8 *)0x0) && ((*(byte *)(_send_result + 3) & 1) == 0)) {
        iVar1 = is_timeout_reached(_send_result[1],pTStack_10->event_send_timeout_secs,
                                   (int *)((long)&l + 4));
        if (iVar1 == 0) {
          if (l._4_4_ != 0) {
            *(undefined1 *)(_send_result + 3) = 1;
            l._0_4_ = 3;
            singlylinkedlist_foreach((SINGLYLINKEDLIST_HANDLE)*_send_result,invoke_callback,&l);
          }
        }
        else {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
                      ,"process_event_send_timeouts",0x528,1,
                      "messenger failed to evaluate event send timeout of event %p",_send_result);
          }
          list_item._4_4_ = 0x529;
        }
      }
    }
  }
  return list_item._4_4_;
}

Assistant:

static int process_event_send_timeouts(TELEMETRY_MESSENGER_INSTANCE* instance)
{
    int result = RESULT_OK;

    if (instance->event_send_timeout_secs > 0)
    {
        LIST_ITEM_HANDLE list_item = singlylinkedlist_get_head_item(instance->in_progress_list);

        while (list_item != NULL)
        {
            MESSENGER_SEND_EVENT_TASK* task = (MESSENGER_SEND_EVENT_TASK*)singlylinkedlist_item_get_value(list_item);

            if (task != NULL && task->is_timed_out == false)
            {
                int is_timed_out;

                if (is_timeout_reached(task->send_time, instance->event_send_timeout_secs, &is_timed_out) == RESULT_OK)
                {
                    if (is_timed_out)
                    {
                        task->is_timed_out = true;
                        TELEMETRY_MESSENGER_EVENT_SEND_COMPLETE_RESULT send_result = TELEMETRY_MESSENGER_EVENT_SEND_COMPLETE_RESULT_ERROR_TIMEOUT;
                        singlylinkedlist_foreach(task->callback_list, invoke_callback, (void*)&send_result);
                    }
                }
                else
                {
                    LogError("messenger failed to evaluate event send timeout of event %p", task);
                    result = MU_FAILURE;
                }
            }

            list_item = singlylinkedlist_get_next_item(list_item);
        }
    }

    return result;
}